

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

char * ngx_conf_merge_path_value
                 (ngx_conf_t *cf,ngx_path_t **path,ngx_path_t *prev,ngx_path_init_t *init)

{
  size_t sVar1;
  u_char *puVar2;
  ngx_path_t *pnVar3;
  ngx_int_t nVar4;
  size_t sVar5;
  long lVar6;
  
  if (*path == (ngx_path_t *)0x0) {
    if (prev == (ngx_path_t *)0x0) {
      pnVar3 = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
      *path = pnVar3;
      if (pnVar3 == (ngx_path_t *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      puVar2 = (init->name).data;
      (pnVar3->name).len = (init->name).len;
      (pnVar3->name).data = puVar2;
      nVar4 = ngx_conf_full_name(cf->cycle,&(*path)->name,0);
      if (nVar4 != 0) {
        return (char *)0xffffffffffffffff;
      }
      pnVar3 = *path;
      sVar5 = pnVar3->len;
      lVar6 = 0;
      do {
        sVar1 = init->level[lVar6];
        sVar5 = (sVar5 + sVar1 + 1) - (ulong)(sVar1 == 0);
        pnVar3->level[lVar6] = sVar1;
        pnVar3->len = sVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      nVar4 = ngx_add_path(cf,path);
      return (char *)-(ulong)(nVar4 != 0);
    }
    *path = prev;
  }
  return (char *)0x0;
}

Assistant:

char *
ngx_conf_merge_path_value(ngx_conf_t *cf, ngx_path_t **path, ngx_path_t *prev,
    ngx_path_init_t *init)
{
    ngx_uint_t  i;

    if (*path) {
        return NGX_CONF_OK;
    }

    if (prev) {
        *path = prev;
        return NGX_CONF_OK;
    }

    *path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (*path == NULL) {
        return NGX_CONF_ERROR;
    }

    (*path)->name = init->name;

    if (ngx_conf_full_name(cf->cycle, &(*path)->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; i < NGX_MAX_PATH_LEVEL; i++) {
        (*path)->level[i] = init->level[i];
        (*path)->len += init->level[i] + (init->level[i] ? 1 : 0);
    }

    if (ngx_add_path(cf, path) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}